

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O2

Matrix3f * __thiscall
Matrix4f::getSubmatrix3x3(Matrix3f *__return_storage_ptr__,Matrix4f *this,int i0,int j0)

{
  float fVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  long lVar5;
  int j;
  long lVar6;
  
  Matrix3f::Matrix3f(__return_storage_ptr__,0.0);
  pfVar3 = this->m_elements + (long)i0 + (long)j0 * 4;
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    pfVar4 = pfVar3;
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      fVar1 = *pfVar4;
      pfVar2 = Matrix3f::operator()(__return_storage_ptr__,(int)lVar5,(int)lVar6);
      *pfVar2 = fVar1;
      pfVar4 = pfVar4 + 4;
    }
    pfVar3 = pfVar3 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix3f Matrix4f::getSubmatrix3x3( int i0, int j0 ) const
{
	Matrix3f out;

	for( int i = 0; i < 3; ++i )
	{
		for( int j = 0; j < 3; ++j )
		{
			out( i, j ) = ( *this )( i + i0, j + j0 );
		}
	}

	return out;
}